

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict struct_declaration_list(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  node_t_conflict n;
  node_t_conflict op;
  node_t_conflict pnVar2;
  node_t_conflict next_el;
  node_t_conflict el;
  node_t_conflict res;
  node_t_conflict r;
  parse_ctx_t parse_ctx;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->parse_ctx;
  n = new_node(c2m_ctx,N_LIST);
  do {
    op = struct_declaration(c2m_ctx,no_err_p);
    if (op == &err_struct) {
      return &err_struct;
    }
    if (op->code == N_LIST) {
      next_el = DLIST_node_t_head(&(op->u).ops);
      while (next_el != (node_t_conflict)0x0) {
        pnVar2 = DLIST_node_t_next(next_el);
        DLIST_node_t_remove(&(op->u).ops,next_el);
        op_append(c2m_ctx,n,next_el);
        next_el = pnVar2;
      }
    }
    else {
      op_append(c2m_ctx,n,op);
    }
  } while ((short)*(undefined4 *)ppVar1->curr_token != 0x7d);
  return n;
}

Assistant:

D (struct_declaration_list) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t r, res, el, next_el;

  res = new_node (c2m_ctx, N_LIST);
  for (;;) {
    P (struct_declaration);
    if (r->code != N_LIST) {
      op_append (c2m_ctx, res, r);
    } else {
      for (el = NL_HEAD (r->u.ops); el != NULL; el = next_el) {
        next_el = NL_NEXT (el);
        NL_REMOVE (r->u.ops, el);
        op_append (c2m_ctx, res, el);
      }
    }
    if (C ('}')) break;
  }
  return res;
}